

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_tapi.cpp
# Opt level: O2

void tqapi_tapi_free_query_result(TradeApi *tapi,QueryResult *result)

{
  CallResult<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this
  ;
  
  this = &result->_data->result;
  if (this != (CallResult<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0) {
    tquant::api::
    CallResult<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~CallResult(this);
  }
  operator_delete(this);
  operator_delete(result);
  return;
}

Assistant:

void tqapi_tapi_free_query_result (TradeApi* tapi, QueryResult * result)
    {
        delete result->_data;
        delete result;
    }